

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void matras_dealloc(matras *m)

{
  void *ext;
  void *ext_00;
  uint id_00;
  uint uVar1;
  bool bVar2;
  void *extent3;
  void **extent2;
  void **extent1;
  _Bool extent3_free;
  matras_id_t n2;
  _Bool extent2_free;
  matras_id_t n1;
  _Bool extent1_free;
  matras_id_t id;
  matras *m_local;
  
  if ((m->head).block_count == 0) {
    __assert_fail("m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x109,"void matras_dealloc(struct matras *)");
  }
  id_00 = (int)(m->head).block_count - 1;
  matras_touch(m,id_00);
  (m->head).block_count = (ulong)id_00;
  uVar1 = m->mask1 & id_00;
  bVar2 = (m->mask2 & uVar1) == 0;
  if (((id_00 == 0) || (uVar1 == 0)) || (bVar2)) {
    ext = (m->head).root;
    ext_00 = *(void **)((long)ext + (ulong)(id_00 >> ((byte)m->shift1 & 0x1f)) * 8);
    if (bVar2) {
      matras_free_extent(m,*(void **)((long)ext_00 + (ulong)(uVar1 >> ((byte)m->shift2 & 0x1f)) * 8)
                        );
    }
    if (uVar1 == 0) {
      matras_free_extent(m,ext_00);
    }
    if (id_00 == 0) {
      matras_free_extent(m,ext);
    }
  }
  return;
}

Assistant:

void
matras_dealloc(struct matras *m)
{
	assert(m->head.block_count);
	matras_id_t id = m->head.block_count - 1;
	matras_touch(m, id);
	m->head.block_count = id;
	/* Current block_count is the ID of deleting block */

	/* See "Shifts and masks explanation" for details */
	/* Deleting extents in same way (but reverse order) like in matras_alloc
	 * See matras_alloc for details. */
	bool extent1_free = !id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	bool extent2_free = !id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	bool extent3_free = !id;

	if (extent1_free || extent2_free || extent3_free) {
		void **extent1, **extent2, *extent3;
		extent1 = (void **)m->head.root;
		extent2 = (void **)extent1[n1];
		extent3 = extent2[n2];
		if (extent3_free)
			matras_free_extent(m, extent3);
		if (extent2_free)
			matras_free_extent(m, extent2);
		if (extent1_free)
			matras_free_extent(m, extent1);
	}
}